

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_float_test.cpp
# Opt level: O0

void __thiscall
reflect_value_cast_float_test_float_to_float_cast_Test::TestBody
          (reflect_value_cast_float_test_float_to_float_cast_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  float f;
  value v;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  AssertHelper in_stack_ffffffffffffffb0;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffffb8;
  AssertionResult local_28;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = value_create_float(0x42c8a5e3);
  local_14 = value_to_float(local_10);
  local_10 = value_type_cast(local_10,5);
  value_to_float(local_10);
  this_00 = &local_28;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((char *)in_stack_ffffffffffffffb8._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,(char *)in_stack_ffffffffffffffb0.data_,
             (float *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),(float *)this_00
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x11f24a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_float_test.cpp"
               ,0x68,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    testing::Message::~Message((Message *)0x11f296);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11f2d6);
  value_destroy(local_10);
  return;
}

Assistant:

TEST_F(reflect_value_cast_float_test, float_to_float_cast)
{
	value v = value_create_float(100.324f);

	float f = value_to_float(v);

	v = value_type_cast(v, TYPE_FLOAT);

	EXPECT_EQ((float)f, (float)value_to_float(v));

	value_destroy(v);
}